

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_JUnitOutputTest_MultipleTestCaseBlocksWithAssertions_TestShell::createTest
          (TEST_JUnitOutputTest_MultipleTestCaseBlocksWithAssertions_TestShell *this)

{
  TEST_JUnitOutputTest_MultipleTestCaseBlocksWithAssertions_Test *this_00;
  
  this_00 = (TEST_JUnitOutputTest_MultipleTestCaseBlocksWithAssertions_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x2c4);
  TEST_JUnitOutputTest_MultipleTestCaseBlocksWithAssertions_Test::
  TEST_JUnitOutputTest_MultipleTestCaseBlocksWithAssertions_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, MultipleTestCaseBlocksWithAssertions)
{
    testCaseRunner->start()
            .withGroup("twoTestsGroup")
            .withTest("firstTestName").thatHasChecks(456)
            .withTest("secondTestName").thatHasChecks(567)
            .end();

    outputFile = fileSystem.file("cpputest_twoTestsGroup.xml");

    STRCMP_EQUAL("<testcase classname=\"twoTestsGroup\" name=\"firstTestName\" assertions=\"456\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));
    STRCMP_EQUAL("<testcase classname=\"twoTestsGroup\" name=\"secondTestName\" assertions=\"567\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(7));
}